

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitVariable
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,Variable v)

{
  Writer *pWVar1;
  Buffer<char> *pBVar2;
  _Alloc_hider __src;
  int in_EDX;
  ptrdiff_t _Num;
  ulong uVar3;
  char *str;
  string local_40;
  
  pWVar1 = this->writer_;
  GenericVarNamer::vname_abi_cxx11_
            (&local_40,
             (GenericVarNamer *)
             (ulong)*(uint *)((long)v.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                    super_ExprBase.impl_ + 4),in_EDX);
  __src._M_p = local_40._M_dataplus._M_p;
  pBVar2 = pWVar1->buffer_;
  uVar3 = pBVar2->size_ + local_40._M_string_length;
  if (pBVar2->capacity_ < uVar3) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar3);
  }
  if (local_40._M_string_length != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,__src._M_p,local_40._M_string_length);
  }
  pBVar2->size_ = uVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VisitVariable(Variable v)
  { writer_ << vnam_.vname(v.index()); }